

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdppm.c
# Opt level: O1

JDIMENSION get_scaled_gray_row(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  JDIMENSION JVar1;
  FILE *pFVar2;
  jpeg_error_mgr *pjVar3;
  JSAMPROW pJVar4;
  _func_void_j_compress_ptr_cjpeg_source_ptr *p_Var5;
  long lVar6;
  
  pFVar2 = sinfo[1].input_file;
  p_Var5 = (_func_void_j_compress_ptr_cjpeg_source_ptr *)
           fread(sinfo[1].start_input,1,(size_t)sinfo[1].finish_input,(FILE *)sinfo->input_file);
  if (p_Var5 != sinfo[1].finish_input) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x2b;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  JVar1 = cinfo->image_width;
  if (JVar1 != 0) {
    p_Var5 = sinfo[1].start_input;
    pJVar4 = *sinfo->buffer;
    lVar6 = 0;
    do {
      pJVar4[lVar6] = *(JSAMPLE *)((long)&pFVar2->_flags + (ulong)(byte)p_Var5[lVar6]);
      lVar6 = lVar6 + 1;
    } while (JVar1 != (JDIMENSION)lVar6);
  }
  return 1;
}

Assistant:

METHODDEF(JDIMENSION)
get_scaled_gray_row(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
/* This version is for reading raw-byte-format PGM files with any maxval */
{
  ppm_source_ptr source = (ppm_source_ptr)sinfo;
  register JSAMPROW ptr;
  register U_CHAR *bufferptr;
  register JSAMPLE *rescale = source->rescale;
  JDIMENSION col;

  if (!ReadOK(source->pub.input_file, source->iobuffer, source->buffer_width))
    ERREXIT(cinfo, JERR_INPUT_EOF);
  ptr = source->pub.buffer[0];
  bufferptr = source->iobuffer;
  for (col = cinfo->image_width; col > 0; col--) {
    *ptr++ = rescale[UCH(*bufferptr++)];
  }
  return 1;
}